

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_112f20f::HandleStringsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  ulong uVar1;
  uint uVar2;
  pointer pcVar3;
  size_type sVar4;
  cmExecutionStatus *pcVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  BOM BVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  string *psVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined7 extraout_var;
  BOM BVar17;
  uint uVar18;
  uint uVar19;
  string *sr;
  pointer pbVar20;
  undefined1 uVar21;
  ulong unaff_RBP;
  char cVar22;
  char cVar23;
  undefined4 uVar24;
  size_type sVar25;
  undefined4 uVar26;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view value;
  string output;
  int limit_output;
  int limit_input;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  string fileName;
  ifstream fin;
  RegularExpression regex;
  string local_3f8;
  uint local_3d8;
  int local_3d4;
  string *local_3d0;
  uint local_3c4;
  undefined8 local_3c0;
  pointer local_3b8;
  undefined8 local_3b0;
  int local_3a4;
  undefined1 local_3a0 [32];
  char local_380 [8];
  char *local_378;
  ulong local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  ulong local_350;
  uint local_344;
  string local_340;
  pointer local_320;
  cmExecutionStatus *local_318;
  pointer local_310;
  undefined1 local_308 [32];
  size_type local_2e8;
  pointer local_2e0;
  RegularExpression local_100;
  
  pbVar20 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20) < 0x41) {
    local_308._0_8_ = local_308 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_308,"STRINGS requires a file name and output variable","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
    }
    uVar21 = 0;
  }
  else {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    pcVar3 = pbVar20[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_340,pcVar3,pcVar3 + pbVar20[1]._M_string_length);
    bVar6 = cmsys::SystemTools::FileIsFullPath(&local_340);
    if (!bVar6) {
      psVar14 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
      local_308._8_8_ = (psVar14->_M_dataplus)._M_p;
      local_308._0_8_ = psVar14->_M_string_length;
      local_308._24_8_ = local_100.regmatch.startp + 2;
      local_100.regmatch.startp[0] = &DAT_00000001;
      local_100.regmatch.startp[2]._0_1_ = 0x2f;
      pbVar20 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_308._16_8_ = 1;
      local_2e0 = pbVar20[1]._M_dataplus._M_p;
      local_2e8 = pbVar20[1]._M_string_length;
      views._M_len = 3;
      views._M_array = (iterator)local_308;
      local_100.regmatch.startp[1] = (char *)local_308._24_8_;
      cmCatViews_abi_cxx11_((string *)local_3a0,views);
      std::__cxx11::string::operator=((string *)&local_340,(string *)local_3a0);
      if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
        operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
      }
    }
    local_320 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    local_3a4 = -1;
    local_3d4 = -1;
    local_100.regmust = (char *)0x0;
    local_100.program = (char *)0x0;
    local_100.progsize = 0;
    memset(&local_100,0,0xaa);
    pbVar20 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar15 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20;
    bVar6 = 0x60 < uVar15;
    local_318 = status;
    if (bVar6) {
      local_3d0 = (string *)&status->Error;
      local_3b8 = (pointer)CONCAT44(local_3b8._4_4_,(int)CONCAT71((int7)((ulong)local_3d0 >> 8),1));
      local_3b0 = (pointer)((ulong)local_3b0._4_4_ << 0x20);
      unaff_RBP = 3;
      uVar13 = 4;
      local_3c4 = 0;
      local_3d8 = 0;
      local_370 = 0;
      local_350 = 0;
      uVar26 = 0;
      local_3c0 = 0;
LAB_0035aa3b:
      uVar15 = unaff_RBP * 0x20;
      iVar8 = std::__cxx11::string::compare((char *)(pbVar20 + unaff_RBP));
      if (iVar8 == 0) {
        uVar26 = 1;
        goto LAB_0035af4e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + unaff_RBP));
      if (iVar8 == 0) {
        uVar26 = 2;
        goto LAB_0035af4e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + unaff_RBP));
      if (iVar8 == 0) {
        uVar26 = 3;
        goto LAB_0035af4e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + unaff_RBP));
      if (iVar8 == 0) {
        uVar26 = 4;
        goto LAB_0035af4e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + unaff_RBP));
      if (iVar8 == 0) {
        uVar26 = 5;
        goto LAB_0035af4e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + unaff_RBP));
      if (iVar8 == 0) {
        uVar26 = 7;
        goto LAB_0035af4e;
      }
      uVar16 = std::__cxx11::string::compare
                         ((char *)((args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + unaff_RBP));
      if ((int)uVar16 == 0) {
        local_350 = CONCAT71((int7)((ulong)uVar16 >> 8),1);
        uVar26 = 0;
        goto LAB_0035af4e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + unaff_RBP));
      uVar24 = 0;
      if (iVar8 == 0) {
        local_3b8 = (pointer)((ulong)local_3b8 & 0xffffffff00000000);
        uVar26 = 0;
        goto LAB_0035af4e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + unaff_RBP));
      if (iVar8 == 0) {
        uVar26 = 8;
        goto LAB_0035af4e;
      }
      switch(uVar26) {
      case 1:
        iVar8 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[unaff_RBP]._M_dataplus.
                                _M_p,"%d",&local_3a4);
        if ((iVar8 == 1) && (uVar26 = 0, -1 < local_3a4)) goto LAB_0035af4e;
        local_308._0_8_ = 0x22;
        local_308._8_8_ = "STRINGS option LIMIT_INPUT value \"";
        pbVar20 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_3a0._8_8_ = pbVar20[unaff_RBP]._M_dataplus._M_p;
        local_3a0._0_8_ = pbVar20[unaff_RBP]._M_string_length;
        cmStrCat<char[30]>(&local_3f8,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a0,
                           (char (*) [30])"\" is not an unsigned integer.");
        std::__cxx11::string::_M_assign(local_3d0);
        break;
      case 2:
        iVar8 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[unaff_RBP]._M_dataplus.
                                _M_p,"%d",&local_3d4);
        if ((iVar8 == 1) && (uVar26 = 0, -1 < local_3d4)) goto LAB_0035af4e;
        local_308._0_8_ = 0x23;
        local_308._8_8_ = "STRINGS option LIMIT_OUTPUT value \"";
        pbVar20 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_3a0._8_8_ = pbVar20[unaff_RBP]._M_dataplus._M_p;
        local_3a0._0_8_ = pbVar20[unaff_RBP]._M_string_length;
        cmStrCat<char[30]>(&local_3f8,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a0,
                           (char (*) [30])"\" is not an unsigned integer.");
        std::__cxx11::string::_M_assign(local_3d0);
        break;
      case 3:
        uVar26 = 0;
        iVar8 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[unaff_RBP]._M_dataplus.
                                _M_p,"%d",&local_368);
        bVar7 = -1 < (int)(uint)local_368.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start && iVar8 == 1;
        uVar19 = (uint)local_368.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = local_3c4;
        if (-1 >= (int)(uint)local_368.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start || iVar8 != 1) {
          local_308._0_8_ = 0x22;
          local_308._8_8_ = "STRINGS option LIMIT_COUNT value \"";
          pbVar20 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_3a0._8_8_ = pbVar20[unaff_RBP]._M_dataplus._M_p;
          local_3a0._0_8_ = pbVar20[unaff_RBP]._M_string_length;
          cmStrCat<char[30]>(&local_3f8,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a0,
                             (char (*) [30])"\" is not an unsigned integer.");
          std::__cxx11::string::_M_assign(local_3d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,
                            CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                     local_3f8.field_2._M_local_buf[0]) + 1);
          }
          uVar26 = 3;
          uVar19 = local_3d8;
          uVar11 = local_3c4;
        }
        goto LAB_0035af25;
      case 4:
        uVar26 = 0;
        iVar9 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[unaff_RBP]._M_dataplus.
                                _M_p,"%d",&local_368);
        bVar7 = -1 < (int)(uint)local_368.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start && iVar9 == 1;
        iVar8 = (uint)local_368.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if (-1 >= (int)(uint)local_368.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start || iVar9 != 1) {
          local_308._0_8_ = 0x25;
          local_308._8_8_ = "STRINGS option LENGTH_MINIMUM value \"";
          pbVar20 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_3a0._8_8_ = pbVar20[unaff_RBP]._M_dataplus._M_p;
          local_3a0._0_8_ = pbVar20[unaff_RBP]._M_string_length;
          cmStrCat<char[30]>(&local_3f8,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a0,
                             (char (*) [30])"\" is not an unsigned integer.");
          std::__cxx11::string::_M_assign(local_3d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,
                            CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                     local_3f8.field_2._M_local_buf[0]) + 1);
          }
          uVar26 = 4;
          iVar8 = (int)local_3b0;
        }
        local_3b0 = (pointer)CONCAT44(local_3b0._4_4_,iVar8);
        uVar19 = local_3d8;
        uVar11 = local_3c4;
        goto LAB_0035af25;
      case 5:
        uVar26 = 0;
        iVar8 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[unaff_RBP]._M_dataplus.
                                _M_p,"%d",&local_368);
        bVar7 = -1 < (int)(uint)local_368.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start && iVar8 == 1;
        uVar19 = local_3d8;
        uVar11 = (uint)local_368.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (-1 >= (int)(uint)local_368.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start || iVar8 != 1) {
          local_308._0_8_ = 0x25;
          local_308._8_8_ = "STRINGS option LENGTH_MAXIMUM value \"";
          pbVar20 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_3a0._8_8_ = pbVar20[unaff_RBP]._M_dataplus._M_p;
          local_3a0._0_8_ = pbVar20[unaff_RBP]._M_string_length;
          cmStrCat<char[30]>(&local_3f8,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a0,
                             (char (*) [30])"\" is not an unsigned integer.");
          std::__cxx11::string::_M_assign(local_3d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,
                            CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                     local_3f8.field_2._M_local_buf[0]) + 1);
          }
          uVar26 = 5;
          uVar19 = local_3d8;
          uVar11 = local_3c4;
        }
LAB_0035af25:
        local_3c4 = uVar11;
        local_3d8 = uVar19;
        unaff_RBP = uVar15;
        if (bVar7) goto LAB_0035af4e;
        goto LAB_0035afb1;
      default:
        local_308._0_8_ = 0x20;
        local_308._8_8_ = "STRINGS given unknown argument \"";
        pbVar20 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_3a0._8_8_ = pbVar20[unaff_RBP]._M_dataplus._M_p;
        local_3a0._0_8_ = pbVar20[unaff_RBP]._M_string_length;
        cmStrCat<char[2]>(&local_3f8,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a0,
                          (char (*) [2])0x79df42);
        std::__cxx11::string::_M_assign(local_3d0);
        break;
      case 7:
        bVar7 = cmsys::RegularExpression::compile
                          (&local_100,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[unaff_RBP]._M_dataplus._M_p);
        if (bVar7) {
          local_370 = CONCAT71(extraout_var,1);
          uVar26 = uVar24;
          goto LAB_0035af4e;
        }
        local_308._0_8_ = 0x1c;
        local_308._8_8_ = "STRINGS option REGEX value \"";
        pbVar20 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_3a0._8_8_ = pbVar20[unaff_RBP]._M_dataplus._M_p;
        local_3a0._0_8_ = pbVar20[unaff_RBP]._M_string_length;
        cmStrCat<char[25]>(&local_3f8,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a0,
                           (char (*) [25])"\" could not be compiled.");
        std::__cxx11::string::_M_assign(local_3d0);
        break;
      case 8:
        iVar8 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + unaff_RBP));
        if (iVar8 == 0) {
          local_3c0 = 1;
          uVar26 = uVar24;
        }
        else {
          iVar8 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + unaff_RBP));
          if (iVar8 == 0) {
            local_3c0 = 3;
            uVar26 = uVar24;
          }
          else {
            iVar8 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + unaff_RBP));
            if (iVar8 == 0) {
              local_3c0 = 2;
              uVar26 = uVar24;
            }
            else {
              iVar8 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + unaff_RBP));
              if (iVar8 == 0) {
                local_3c0 = 5;
                uVar26 = uVar24;
              }
              else {
                iVar8 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + unaff_RBP))
                ;
                if (iVar8 != 0) {
                  local_308._0_8_ = 0x19;
                  local_308._8_8_ = "STRINGS option ENCODING \"";
                  pbVar20 = (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  local_3a0._8_8_ = pbVar20[unaff_RBP]._M_dataplus._M_p;
                  local_3a0._0_8_ = pbVar20[unaff_RBP]._M_string_length;
                  cmStrCat<char[18]>(&local_3f8,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a0,
                                     (char (*) [18])"\" not recognized.");
                  std::__cxx11::string::_M_assign(local_3d0);
                  break;
                }
                local_3c0 = 4;
                uVar26 = uVar24;
              }
            }
          }
        }
        goto LAB_0035af4e;
      }
      unaff_RBP = uVar15;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                 local_3f8.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0035afb1;
    }
    local_3c0 = 0;
    local_3b8 = (pointer)CONCAT44(local_3b8._4_4_,(int)CONCAT71((int7)(uVar15 >> 8),1));
    local_350 = 0;
    local_370 = 0;
    local_3d8 = 0;
    local_3c4 = 0;
    local_3b0 = (pointer)((ulong)local_3b0._4_4_ << 0x20);
LAB_0035afb1:
    pcVar5 = local_318;
    uVar13 = local_3d8;
    if (bVar6) {
      uVar21 = 0;
    }
    else {
      if (((ulong)local_3b8 & 1) != 0) {
        psVar14 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_318->Makefile);
        local_308._8_8_ = (psVar14->_M_dataplus)._M_p;
        local_308._0_8_ = psVar14->_M_string_length;
        local_308._16_8_ = 0x28;
        local_308._24_8_ = "/CMakeFiles/FileCommandStringsBinaryFile";
        views_00._M_len = 2;
        views_00._M_array = (iterator)local_308;
        cmCatViews_abi_cxx11_((string *)local_3a0,views_00);
        bVar6 = cmHexFileConverter::TryConvert(&local_340,(string *)local_3a0);
        if (bVar6) {
          std::__cxx11::string::_M_assign((string *)&local_340);
        }
        if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
          operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
        }
      }
      std::ifstream::ifstream(local_308,local_340._M_dataplus._M_p,_S_in);
      bVar6 = (*(byte *)((long)&local_2e8 + *(long *)(local_308._0_8_ - 0x18)) & 5) == 0;
      uVar15 = CONCAT71((int7)(unaff_RBP >> 8),bVar6);
      if (bVar6) {
        local_344 = (uint)uVar15;
        BVar10 = cmsys::FStream::ReadBOM((istream *)local_308);
        local_320 = local_320 + 2;
        BVar17 = (BOM)local_3c0;
        if (BVar10 == BOM_None) {
          BVar10 = BVar17;
        }
        if (BVar17 != BOM_None) {
          BVar10 = BVar17;
        }
        local_3c0 = CONCAT44(local_3c0._4_4_,BVar10);
        uVar19 = 3;
        if ((BVar10 & ~BOM_UTF8) != BOM_UTF32BE) {
          uVar19 = (uint)((BVar10 & ~BOM_UTF8) == BOM_UTF16BE);
        }
        local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3a0._0_8_ = local_3a0 + 0x10;
        local_3a0._8_8_ = (pointer)0x0;
        local_3a0._16_8_ = local_3a0._16_8_ & 0xffffffffffffff00;
        local_3d0 = (string *)(ulong)uVar13;
        local_3b0 = (pointer)((ulong)local_3b0 & 0xffffffff);
        local_310 = (pointer)(ulong)local_3c4;
        pbVar20 = (pointer)0x0;
        do {
          cVar22 = (char)&local_3f8;
          if ((((uVar13 != 0) &&
               (local_3d0 <=
                (string *)
                ((long)local_368.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_368.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5))) ||
              ((-1 < local_3a4 && (iVar8 = std::istream::tellg(), local_3a4 <= iVar8)))) ||
             ((*(byte *)((long)&local_2e8 + *(long *)(local_308._0_8_ - 0x18)) & 5) != 0)) break;
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          local_3f8._M_string_length = 0;
          local_3f8.field_2._M_local_buf[0] = '\0';
          uVar11 = std::istream::get();
          cVar23 = (char)local_308;
          local_3b8 = pbVar20;
          if (uVar19 != 0) {
            uVar18 = 1;
            do {
              uVar12 = std::istream::get();
              uVar2 = *(uint *)((long)&local_2e8 + *(long *)(local_308._0_8_ - 0x18));
              if ((uVar2 & 5) == 0) {
                uVar11 = uVar11 << 8 | uVar12;
              }
              else {
                std::istream::putback(cVar23);
              }
            } while (((uVar2 & 5) == 0) && (bVar6 = uVar18 < uVar19, uVar18 = uVar18 + 1, bVar6));
          }
          pbVar20 = local_3b8;
          if ((int)local_3c0 == 5) {
            uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                     uVar11 << 0x18;
          }
          else if ((int)local_3c0 == 3) {
            uVar11 = (uint)(ushort)((ushort)uVar11 << 8 | (ushort)uVar11 >> 8);
          }
          if (uVar11 == 0xd) {
LAB_0035b55e:
            bVar6 = false;
          }
          else {
            if (uVar11 < 0x100) {
              iVar8 = isprint(uVar11);
              if ((byte)(uVar11 == 10 & (byte)local_350 | (uVar11 == 9 || iVar8 != 0)) != 1)
              goto LAB_0035b2e8;
              std::__cxx11::string::push_back(cVar22);
            }
            else {
LAB_0035b2e8:
              if ((int)local_3c0 == 1) {
                uVar15 = 0;
                do {
                  uVar13 = HandleStringsCommand::utf8_check_table[uVar15][0] & uVar11;
                  uVar1 = uVar15 + 1;
                  uVar18 = (uint)HandleStringsCommand::utf8_check_table[uVar15][1];
                  if (uVar13 == uVar18) break;
                  bVar6 = uVar15 < 2;
                  uVar15 = uVar1;
                } while (bVar6);
                uVar2 = (int)uVar1 + 1;
                if (uVar13 != uVar18) {
                  uVar2 = 0;
                }
                if (uVar13 == uVar18) {
                  iVar8 = 0;
                  do {
                    if ((iVar8 != 0) &&
                       ((uVar11 = std::istream::get(), (uVar11 & 0xc0) != 0x80 ||
                        ((*(uint *)((long)&local_2e8 + *(long *)(local_308._0_8_ - 0x18)) & 5) != 0)
                        ))) {
                      std::istream::putback(cVar23);
                      break;
                    }
                    std::__cxx11::string::push_back(cVar22);
                    iVar8 = iVar8 + 1;
                  } while (uVar2 + (uVar2 == 0) != iVar8);
                }
                pbVar20 = local_3b8;
                uVar13 = local_3d8;
                if (local_3f8._M_string_length != uVar2) {
                  if (local_3f8._M_string_length != 1) {
                    uVar15 = 1;
                    do {
                      std::istream::putback(cVar23);
                      bVar6 = uVar15 < local_3f8._M_string_length - 1;
                      uVar15 = (ulong)((int)uVar15 + 1);
                    } while (bVar6);
                  }
                  local_3f8._M_string_length = 0;
                  *local_3f8._M_dataplus._M_p = '\0';
                }
              }
            }
            if (uVar11 == 10 && (local_350 & 1) == 0) {
              if (((ulong)local_3a0._8_8_ < local_3b0) ||
                 (((local_370 & 1) != 0 &&
                  (bVar6 = cmsys::RegularExpression::find
                                     (&local_100,(char *)local_3a0._0_8_,&local_100.regmatch),
                  !bVar6)))) {
LAB_0035b4e8:
                local_3a0._8_8_ = (pointer)0x0;
                *(char *)local_3a0._0_8_ = '\0';
                goto LAB_0035b4f9;
              }
              uVar11 = (int)pbVar20 + local_3a0._8_4_ + 1;
              pbVar20 = (pointer)(ulong)uVar11;
              if ((local_3d4 < 0) || ((int)uVar11 < local_3d4)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_368,(value_type *)local_3a0);
                goto LAB_0035b4e8;
              }
LAB_0035b550:
              bVar6 = true;
            }
            else {
              if (local_3f8._M_string_length == 0) {
                if (((pointer)local_3a0._8_8_ != (pointer)0x0 && local_3b0 <= (ulong)local_3a0._8_8_
                    ) && (((local_370 & 1) == 0 ||
                          (bVar6 = cmsys::RegularExpression::find
                                             (&local_100,(char *)local_3a0._0_8_,&local_100.regmatch
                                             ), bVar6)))) {
                  uVar11 = (int)pbVar20 + local_3a0._8_4_ + 1;
                  pbVar20 = (pointer)(ulong)uVar11;
                  if ((-1 < local_3d4) && (local_3d4 <= (int)uVar11)) goto LAB_0035b550;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_368,(value_type *)local_3a0);
                }
                goto LAB_0035b4e8;
              }
              std::__cxx11::string::_M_append(local_3a0,(ulong)local_3f8._M_dataplus._M_p);
LAB_0035b4f9:
              if ((local_3c4 == 0) || ((pointer)local_3a0._8_8_ != local_310)) goto LAB_0035b55e;
              if ((local_3b0 <= (ulong)local_3a0._8_8_) &&
                 (((local_370 & 1) == 0 ||
                  (bVar6 = cmsys::RegularExpression::find
                                     (&local_100,(char *)local_3a0._0_8_,&local_100.regmatch), bVar6
                  )))) {
                uVar11 = (int)pbVar20 + local_3a0._8_4_ + 1;
                pbVar20 = (pointer)(ulong)uVar11;
                if ((-1 < local_3d4) && (local_3d4 <= (int)uVar11)) goto LAB_0035b550;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_368,(value_type *)local_3a0);
              }
              bVar6 = false;
            }
            local_3a0._8_8_ = (pointer)0x0;
            *(char *)local_3a0._0_8_ = '\0';
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,
                            CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                     local_3f8.field_2._M_local_buf[0]) + 1);
          }
        } while (!bVar6);
        if (((((uVar13 == 0) ||
              ((string *)
               ((long)local_368.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_368.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < local_3d0)) &&
             ((pointer)local_3a0._8_8_ != (pointer)0x0)) &&
            ((local_3b0 <= (ulong)local_3a0._8_8_ &&
             (((local_370 & 1) == 0 ||
              (bVar6 = cmsys::RegularExpression::find
                                 (&local_100,(char *)local_3a0._0_8_,&local_100.regmatch), bVar6))))
            )) && ((local_3d4 < 0 || (local_3a0._8_4_ + (int)pbVar20 + 1 < local_3d4)))) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_368,(value_type *)local_3a0);
        }
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        local_3f8._M_string_length = 0;
        local_3f8.field_2._M_local_buf[0] = '\0';
        local_3b8 = local_368.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pbVar20 = local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_368.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_368.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            std::__cxx11::string::append((char *)&local_3f8);
            sVar4 = pbVar20->_M_string_length;
            if (sVar4 != 0) {
              pcVar3 = (pbVar20->_M_dataplus)._M_p;
              sVar25 = 0;
              do {
                if (pcVar3[sVar25] == ';') {
                  std::__cxx11::string::push_back(cVar22);
                }
                std::__cxx11::string::push_back(cVar22);
                sVar25 = sVar25 + 1;
              } while (sVar4 != sVar25);
            }
            pbVar20 = pbVar20 + 1;
          } while (pbVar20 != local_3b8);
        }
        value._M_str = local_3f8._M_dataplus._M_p;
        value._M_len = local_3f8._M_string_length;
        cmMakefile::AddDefinition(local_318->Makefile,local_320,value);
        uVar15 = (ulong)local_344;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                   local_3f8.field_2._M_local_buf[0]) + 1);
        }
        if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
          operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_368);
      }
      else {
        local_3a0._0_8_ = (char *)0xe;
        local_3a0._8_8_ = "STRINGS file \"";
        local_3a0._16_8_ = local_340._M_string_length;
        local_3a0._24_8_ = local_340._M_dataplus._M_p;
        local_380[0] = '\x11';
        local_380[1] = '\0';
        local_380[2] = '\0';
        local_380[3] = '\0';
        local_380[4] = '\0';
        local_380[5] = '\0';
        local_380[6] = '\0';
        local_380[7] = '\0';
        local_378 = "\" cannot be read.";
        views_01._M_len = 3;
        views_01._M_array = (iterator)local_3a0;
        cmCatViews_abi_cxx11_(&local_3f8,views_01);
        std::__cxx11::string::_M_assign((string *)&pcVar5->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                   local_3f8.field_2._M_local_buf[0]) + 1);
        }
      }
      uVar21 = (undefined1)uVar15;
      std::ifstream::~ifstream(local_308);
    }
    if (local_100.program != (char *)0x0) {
      operator_delete__(local_100.program);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  return (bool)uVar21;
LAB_0035af4e:
  unaff_RBP = (ulong)uVar13;
  pbVar20 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >> 5;
  uVar13 = uVar13 + 1;
  bVar6 = unaff_RBP < uVar15;
  if (uVar15 <= unaff_RBP) goto LAB_0035afb1;
  goto LAB_0035aa3b;
}

Assistant:

bool HandleStringsCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("STRINGS requires a file name and output variable");
    return false;
  }

  // Get the file to read.
  std::string fileName = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }

  // Get the variable in which to store the results.
  std::string const& outVar = args[2];

  // Parse the options.
  enum
  {
    arg_none,
    arg_limit_input,
    arg_limit_output,
    arg_limit_count,
    arg_length_minimum,
    arg_length_maximum,
    arg_maximum,
    arg_regex,
    arg_encoding
  };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum
  {
    encoding_none = cmsys::FStream::BOM_None,
    encoding_utf8 = cmsys::FStream::BOM_UTF8,
    encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
    encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
    encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
    encoding_utf32be = cmsys::FStream::BOM_UTF32BE
  };
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "LIMIT_INPUT") {
      arg_mode = arg_limit_input;
    } else if (args[i] == "LIMIT_OUTPUT") {
      arg_mode = arg_limit_output;
    } else if (args[i] == "LIMIT_COUNT") {
      arg_mode = arg_limit_count;
    } else if (args[i] == "LENGTH_MINIMUM") {
      arg_mode = arg_length_minimum;
    } else if (args[i] == "LENGTH_MAXIMUM") {
      arg_mode = arg_length_maximum;
    } else if (args[i] == "REGEX") {
      arg_mode = arg_regex;
    } else if (args[i] == "NEWLINE_CONSUME") {
      newline_consume = true;
      arg_mode = arg_none;
    } else if (args[i] == "NO_HEX_CONVERSION") {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
    } else if (args[i] == "ENCODING") {
      arg_mode = arg_encoding;
    } else if (arg_mode == arg_limit_input) {
      if (sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
          limit_input < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_INPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_output) {
      if (sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
          limit_output < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_OUTPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_count) {
      int count;
      if (sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_COUNT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      limit_count = count;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_minimum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MINIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      minlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_maximum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MAXIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      maxlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_regex) {
      if (!regex.compile(args[i])) {
        status.SetError(cmStrCat("STRINGS option REGEX value \"", args[i],
                                 "\" could not be compiled."));
        return false;
      }
      have_regex = true;
      arg_mode = arg_none;
    } else if (arg_mode == arg_encoding) {
      if (args[i] == "UTF-8") {
        encoding = encoding_utf8;
      } else if (args[i] == "UTF-16LE") {
        encoding = encoding_utf16le;
      } else if (args[i] == "UTF-16BE") {
        encoding = encoding_utf16be;
      } else if (args[i] == "UTF-32LE") {
        encoding = encoding_utf32le;
      } else if (args[i] == "UTF-32BE") {
        encoding = encoding_utf32be;
      } else {
        status.SetError(cmStrCat("STRINGS option ENCODING \"", args[i],
                                 "\" not recognized."));
        return false;
      }
      arg_mode = arg_none;
    } else {
      status.SetError(
        cmStrCat("STRINGS given unknown argument \"", args[i], "\""));
      return false;
    }
  }

  if (hex_conversion_enabled) {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName =
      cmStrCat(status.GetMakefile().GetCurrentBinaryDirectory(),
               "/CMakeFiles/FileCommandStringsBinaryFile");
    if (cmHexFileConverter::TryConvert(fileName, binaryFileName)) {
      fileName = binaryFileName;
    }
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str());
#endif
  if (!fin) {
    status.SetError(
      cmStrCat("STRINGS file \"", fileName, "\" cannot be read."));
    return false;
  }

  // If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if (encoding == encoding_none && bom_found != cmsys::FStream::BOM_None) {
    encoding = bom_found;
  }

  unsigned int bytes_rem = 0;
  if (encoding == encoding_utf16le || encoding == encoding_utf16be) {
    bytes_rem = 1;
  }
  if (encoding == encoding_utf32le || encoding == encoding_utf32be) {
    bytes_rem = 3;
  }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while ((!limit_count || strings.size() < limit_count) &&
         (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
         fin) {
    std::string current_str;

    int c = fin.get();
    for (unsigned int i = 0; i < bytes_rem; ++i) {
      int c1 = fin.get();
      if (!fin) {
        fin.putback(static_cast<char>(c1));
        break;
      }
      c = (c << 8) | c1;
    }
    if (encoding == encoding_utf16le) {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
    } else if (encoding == encoding_utf32le) {
      c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) | ((c & 0xFF0000) >> 8) |
           ((c & 0xFF000000) >> 24));
    }

    if (c == '\r') {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
    }

    if (c >= 0 && c <= 0xFF &&
        (isprint(c) || c == '\t' || (c == '\n' && newline_consume))) {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
    } else if (encoding == encoding_utf8) {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] = {
        { 0xE0, 0xC0 },
        { 0xF0, 0xE0 },
        { 0xF8, 0xF0 },
      };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for (unsigned int j = 0; num_utf8_bytes == 0 && j < 3; j++) {
        if ((c & utf8_check_table[j][0]) == utf8_check_table[j][1]) {
          num_utf8_bytes = j + 2;
        }
      }

      // get subsequent octets and check that they are valid
      for (unsigned int j = 0; j < num_utf8_bytes; j++) {
        if (j != 0) {
          c = fin.get();
          if (!fin || (c & 0xC0) != 0x80) {
            fin.putback(static_cast<char>(c));
            break;
          }
        }
        current_str += static_cast<char>(c);
      }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if ((current_str.length() != num_utf8_bytes)) {
        for (unsigned int j = 0; j < current_str.size() - 1; j++) {
          fin.putback(current_str[current_str.size() - 1 - j]);
        }
        current_str.clear();
      }
    }

    if (c == '\n' && !newline_consume) {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else if (current_str.empty()) {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if (s.length() >= minlen && !s.empty() &&
          (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else {
      s += current_str;
    }

    if (maxlen > 0 && s.size() == maxlen) {
      // Terminate a string if the maximum length is reached.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }
      s.clear();
    }
  }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if ((!limit_count || strings.size() < limit_count) && !s.empty() &&
      s.length() >= minlen && (!have_regex || regex.find(s))) {
    output_size += static_cast<int>(s.size()) + 1;
    if (limit_output < 0 || output_size < limit_output) {
      strings.push_back(s);
    }
  }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for (std::string const& sr : strings) {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    for (char i : sr) {
      if (i == ';') {
        output += '\\';
      }
      output += i;
    }
  }

  // Save the output in a makefile variable.
  status.GetMakefile().AddDefinition(outVar, output);
  return true;
}